

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnImportMemory
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index memory_index,Limits *page_limits)

{
  PrintDetails(this," - memory[%u] pages: initial=%ld",(ulong)memory_index,page_limits->initial,
               field_name._M_len,field_name._M_str);
  if (page_limits->has_max == true) {
    PrintDetails(this," max=%ld",page_limits->max);
  }
  if (page_limits->is_shared == true) {
    PrintDetails(this," shared");
  }
  if (page_limits->is_64 == true) {
    PrintDetails(this," i64");
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name._M_len & 0xffffffff,module_name._M_str,
               field_name._M_len & 0xffffffff,field_name._M_str);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportMemory(Index import_index,
                                           std::string_view module_name,
                                           std::string_view field_name,
                                           Index memory_index,
                                           const Limits* page_limits) {
  PrintDetails(" - memory[%" PRIindex "] pages: initial=%" PRId64, memory_index,
               page_limits->initial);
  if (page_limits->has_max) {
    PrintDetails(" max=%" PRId64, page_limits->max);
  }
  if (page_limits->is_shared) {
    PrintDetails(" shared");
  }
  if (page_limits->is_64) {
    PrintDetails(" i64");
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}